

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmMap.c
# Opt level: O2

int Mpm_ManExploreNewCut
              (Mpm_Man_t *p,Mig_Obj_t *pObj,Mpm_Cut_t *pCut0,Mpm_Cut_t *pCut1,Mpm_Cut_t *pCut2,
              int Required)

{
  Mig_Fan_t MVar1;
  Mig_Fan_t MVar2;
  int iVar3;
  uint uVar4;
  Mpm_Cut_t *pMVar5;
  Mig_Fan_t MVar6;
  Mpm_Cut_t *local_48;
  
  if (*(uint *)&pCut0->field_0x4 >> 0x1b < *(uint *)&pCut1->field_0x4 >> 0x1b) {
    pMVar5 = Mpm_ManMergeCuts(p,pCut1,pCut0,pCut2);
    if (pMVar5 == (Mpm_Cut_t *)0x0) goto LAB_003c6fbe;
    local_48 = pMVar5;
    if (p->pPars->fUseTruth == 0) {
      if (p->pPars->fUseDsd != 0) {
        MVar1 = pObj->pFans[0];
        MVar2 = pObj->pFans[1];
        MVar6 = (Mig_Fan_t)~(uint)pObj->pFans[2];
        iVar3 = Mig_ObjNodeType(pObj);
        pMVar5 = pCut0;
LAB_003c707b:
        uVar4 = Mpm_CutComputeDsd6(p,local_48,pCut1,pMVar5,pCut2,(uint)MVar2 & 1,(uint)MVar1 & 1,
                                   (uint)MVar6 & 1,iVar3);
        pMVar5 = (Mpm_Cut_t *)(ulong)uVar4;
        if (uVar4 == 0) goto LAB_003c6fbe;
      }
    }
    else {
      MVar1 = pObj->pFans[0];
      MVar2 = pObj->pFans[1];
      MVar6 = (Mig_Fan_t)~(uint)pObj->pFans[2];
      iVar3 = Mig_ObjNodeType(pObj);
      pMVar5 = pCut0;
LAB_003c6f86:
      Mpm_CutComputeTruth(p,local_48,pCut1,pMVar5,pCut2,(uint)MVar2 & 1,(uint)MVar1 & 1,
                          (uint)MVar6 & 1,iVar3);
    }
  }
  else {
    pMVar5 = Mpm_ManMergeCuts(p,pCut0,pCut1,pCut2);
    if (pMVar5 == (Mpm_Cut_t *)0x0) goto LAB_003c6fbe;
    local_48 = pMVar5;
    if (p->pPars->fUseTruth != 0) {
      MVar2 = pObj->pFans[0];
      MVar1 = pObj->pFans[1];
      MVar6 = pObj->pFans[2];
      iVar3 = Mig_ObjNodeType(pObj);
      pMVar5 = pCut1;
      pCut1 = pCut0;
      goto LAB_003c6f86;
    }
    if (p->pPars->fUseDsd != 0) {
      MVar2 = pObj->pFans[0];
      MVar1 = pObj->pFans[1];
      MVar6 = pObj->pFans[2];
      iVar3 = Mig_ObjNodeType(pObj);
      pMVar5 = pCut1;
      pCut1 = pCut0;
      goto LAB_003c707b;
    }
  }
  uVar4 = Mpm_CutGetArrTime(p,local_48);
  pMVar5 = (Mpm_Cut_t *)(ulong)uVar4;
  if (((int)uVar4 <= Required) || (p->fMainRun == 0)) {
    iVar3 = Mpm_ObjAddCutToStore(p,local_48,uVar4);
    return iVar3;
  }
LAB_003c6fbe:
  return (int)pMVar5;
}

Assistant:

static inline int Mpm_ManExploreNewCut( Mpm_Man_t * p, Mig_Obj_t * pObj, Mpm_Cut_t * pCut0, Mpm_Cut_t * pCut1, Mpm_Cut_t * pCut2, int Required )
{
    Mpm_Cut_t * pCut;
    int ArrTime;
#ifdef MIG_RUNTIME
abctime clk = clock();
#endif

    if ( pCut0->nLeaves >= pCut1->nLeaves )
    {
        pCut = Mpm_ManMergeCuts( p, pCut0, pCut1, pCut2 );
#ifdef MIG_RUNTIME
p->timeMerge += clock() - clk;
#endif
        if ( pCut == NULL )
            return 1;
        if ( p->pPars->fUseTruth )
            Mpm_CutComputeTruth( p, pCut, pCut0, pCut1, pCut2, Mig_ObjFaninC0(pObj), Mig_ObjFaninC1(pObj), Mig_ObjFaninC2(pObj), Mig_ObjNodeType(pObj) ); 
        else if ( p->pPars->fUseDsd )
        {
            if ( !Mpm_CutComputeDsd6( p, pCut, pCut0, pCut1, pCut2, Mig_ObjFaninC0(pObj), Mig_ObjFaninC1(pObj), Mig_ObjFaninC2(pObj), Mig_ObjNodeType(pObj) ) )
                return 1;
        }
    }
    else
    {
        pCut = Mpm_ManMergeCuts( p, pCut1, pCut0, pCut2 );
#ifdef MIG_RUNTIME
p->timeMerge += clock() - clk;
#endif
        if ( pCut == NULL )
            return 1;
        if ( p->pPars->fUseTruth )
            Mpm_CutComputeTruth( p, pCut, pCut1, pCut0, pCut2, Mig_ObjFaninC1(pObj), Mig_ObjFaninC0(pObj), 1 ^ Mig_ObjFaninC2(pObj), Mig_ObjNodeType(pObj) ); 
        else if ( p->pPars->fUseDsd )
        {
            if ( !Mpm_CutComputeDsd6( p, pCut, pCut1, pCut0, pCut2, Mig_ObjFaninC1(pObj), Mig_ObjFaninC0(pObj), 1 ^ Mig_ObjFaninC2(pObj), Mig_ObjNodeType(pObj) ) )
                return 1;
        }
    }

#ifdef MIG_RUNTIME
clk = clock();
#endif
    ArrTime = Mpm_CutGetArrTime( p, pCut );
#ifdef MIG_RUNTIME
p->timeEval += clock() - clk;
#endif
    if ( p->fMainRun && ArrTime > Required )
        return 1;

#ifdef MIG_RUNTIME
clk = Abc_Clock();
#endif
    Mpm_ObjAddCutToStore( p, pCut, ArrTime );
#ifdef MIG_RUNTIME
p->timeStore += Abc_Clock() - clk;
#endif

/*
    // return 0 if const or buffer cut is derived - reset all cuts to contain only one --- does not work
//    if ( pCut->nLeaves < 2 && p->nCutStore == 1 )
//        return 0;
    if ( pCut->nLeaves < 2 ) 
    {
        int i;
        assert( p->nCutStore >= 1 );
        for ( i = 1; i < p->nCutStore; i++ )
            Vec_PtrPush( &p->vFreeUnits, p->pCutStore[i] );
        p->nCutStore = 1;
        return 0;
    }
*/
    return 1;
}